

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::score_basename_greedy
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  unsigned_long *puVar4;
  difference_type dVar5;
  long in_RDI;
  CharCount current_submatch;
  const_iterator query_last;
  Iterator query_it;
  const_iterator item_last;
  Iterator item_it;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  unsigned_long local_30;
  char *local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  char *local_18;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_10 [2];
  
  local_10[0]._M_current = *(char **)(in_RDI + 0x20);
  local_18 = (char *)std::vector<char,_std::allocator<char>_>::cend(in_stack_ffffffffffffffb8);
  local_20._M_current = *(char **)(in_RDI + 0x40);
  local_28 = (char *)std::vector<char,_std::allocator<char>_>::cend(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                     in_stack_ffffffffffffffb8);
  if ((!bVar1) &&
     (bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffffb8), !bVar1)) {
    local_30 = 0;
    do {
      pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(local_10);
      iVar2 = (int)*pcVar3;
      pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_20);
      if (iVar2 == *pcVar3) {
        __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
        operator++(&local_20);
        local_30 = local_30 + 1;
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                            *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                           (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffffb8);
        if (bVar1) break;
      }
      else {
        puVar4 = std::max<unsigned_long>((unsigned_long *)(in_RDI + 0x68),&local_30);
        *(unsigned_long *)(in_RDI + 0x68) = *puVar4;
        local_30 = 0;
      }
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator++(local_10);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                          *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffffb8);
    } while (!bVar1);
    puVar4 = std::max<unsigned_long>((unsigned_long *)(in_RDI + 0x68),&local_30);
    *(unsigned_long *)(in_RDI + 0x68) = *puVar4;
    dVar5 = __gnu_cxx::operator-
                      ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )in_stack_ffffffffffffffb8);
    *(difference_type *)(in_RDI + 0x90) = dVar5 + -1;
  }
  return;
}

Assistant:

void score_basename_greedy() {
    auto item_it = item_basename_;
    auto const item_last = item_.cend();
    auto query_it = qit_basename_;
    auto const query_last = query_.cend();
    if (item_it == item_last || query_it == query_last) {
      return;
    }

    CharCount current_submatch = 0;

    while (true) {
      if (*item_it == *query_it) {
        ++query_it;
        current_submatch++;
        if (query_it == query_last) {
          break;
        }
      } else {
        basename_longest_submatch_ =
            std::max(basename_longest_submatch_, current_submatch);
        current_submatch = 0;
      }
      ++item_it;
      if (item_it == item_last) {
        break;
      }
    }
    basename_longest_submatch_ =
        std::max(basename_longest_submatch_, current_submatch);
    // -1 here because we broke out upon reaching the last match (`query_it ==
    // query_last`) before incrementing `item_it`.
    unmatched_suffix_len_ = item_last - item_it - 1;
  }